

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O3

ScalarFunctionSet *
duckdb::GetIntegralDecompressFunctionSet
          (ScalarFunctionSet *__return_storage_ptr__,LogicalType *result_type)

{
  idx_t iVar1;
  idx_t iVar2;
  ScalarFunctionSet *extraout_RAX;
  LogicalType *in_RDX;
  LogicalType *input_type;
  LogicalType *local_190;
  LogicalType *local_188;
  string local_178;
  ScalarFunction local_158;
  
  IntegralDecompressFunctionName_abi_cxx11_(&local_178,(duckdb *)result_type,in_RDX);
  ScalarFunctionSet::ScalarFunctionSet(__return_storage_ptr__,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  CMUtils::IntegralTypes();
  if (local_190 != local_188) {
    input_type = local_190;
    do {
      iVar1 = GetTypeIdSize(result_type->physical_type_);
      iVar2 = GetTypeIdSize(input_type->physical_type_);
      if (iVar2 < iVar1) {
        CMIntegralDecompressFun::GetFunction(&local_158,input_type,result_type);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&(__return_storage_ptr__->super_FunctionSet<duckdb::ScalarFunction>).functions.
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_158);
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_02432a00;
        if (local_158.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_158.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_158.function.super__Function_base._M_manager)
                    ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,
                     __destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
      }
      input_type = input_type + 1;
    } while (input_type != local_188);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_190);
  return extraout_RAX;
}

Assistant:

static ScalarFunctionSet GetIntegralDecompressFunctionSet(const LogicalType &result_type) {
	ScalarFunctionSet set(IntegralDecompressFunctionName(result_type));
	for (const auto &input_type : CMUtils::IntegralTypes()) {
		if (GetTypeIdSize(result_type.InternalType()) > GetTypeIdSize(input_type.InternalType())) {
			set.AddFunction(CMIntegralDecompressFun::GetFunction(input_type, result_type));
		}
	}
	return set;
}